

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arsenal.cpp
# Opt level: O3

vector<double,_std::allocator<double>_> *
AfterburnerUtil::stringToDoubles
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,string *str)

{
  pointer pcVar1;
  iterator __position;
  double val;
  stringstream sst;
  undefined1 *local_1c0 [2];
  undefined1 local_1b0 [16];
  double local_1a0 [4];
  byte abStack_180 [96];
  ios_base local_120 [264];
  
  pcVar1 = (str->_M_dataplus)._M_p;
  local_1c0[0] = local_1b0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1c0,pcVar1,pcVar1 + str->_M_string_length);
  std::__cxx11::string::append((char *)local_1c0);
  std::__cxx11::stringstream::stringstream
            ((stringstream *)local_1a0,(string *)local_1c0,_S_out|_S_in);
  if (local_1c0[0] != local_1b0) {
    operator_delete(local_1c0[0]);
  }
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::istream::_M_extract<double>(local_1a0);
  while ((abStack_180[*(long *)((long)local_1a0[0] + -0x18)] & 2) == 0) {
    __position._M_current =
         (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)__return_storage_ptr__,__position,
                 (double *)local_1c0);
    }
    else {
      *__position._M_current = (double)local_1c0[0];
      (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    std::istream::_M_extract<double>(local_1a0);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> stringToDoubles(std::string str) {
    // Return a vector of doubles from the string "str". "str" should
    // be a string containing a line of data.
    // add a blank at the end so the last data will be read
    std::stringstream sst(str + " ");
    std::vector<double> valueList;
    double val;
    sst >> val;
    while (sst.eof() == false) {
        valueList.push_back(val);
        sst >> val;
    }
    return valueList;
}